

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileListOperation<double>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<double>>
               (ReservoirQuantileState<double> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  double *__first;
  data_ptr_t pdVar2;
  FunctionData *pFVar3;
  Vector *pVVar4;
  idx_t iVar5;
  reference pvVar6;
  ulong uVar7;
  size_t q;
  ulong __n;
  uint64_t uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  if (state->pos != 0) {
    pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar4 = ListVector::GetEntry(finalize_data->result);
    iVar5 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar3[2]._vptr_FunctionData - (long)pFVar3[1]._vptr_FunctionData >>
                        3) + iVar5);
    __first = state->v;
    pdVar2 = pVVar4->data;
    target->offset = iVar5;
    uVar8 = (long)pFVar3[2]._vptr_FunctionData - (long)pFVar3[1]._vptr_FunctionData >> 3;
    target->length = uVar8;
    for (__n = 0; __n < uVar8; __n = __n + 1) {
      pvVar6 = vector<double,_true>::get<true>((vector<double,_true> *)(pFVar3 + 1),__n);
      lVar1 = state->pos - 1;
      auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = 0x45300000;
      dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * *pvVar6;
      uVar7 = (ulong)dVar10;
      ::std::nth_element<double*>
                (__first,__first + ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f |
                                   uVar7),__first + state->pos);
      *(double *)(pdVar2 + __n * 8 + iVar5 * 8) =
           __first[(long)(dVar10 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7];
      uVar8 = target->length;
    }
    ListVector::SetListSize(finalize_data->result,uVar8 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}